

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O2

void __thiscall rudp::rudp_server::receive(rudp_server *this)

{
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *this_00;
  basic_endpoint<boost::asio::ip::udp> *__p;
  shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> from;
  buffer_ptr_t data;
  anon_class_40_3_881517fd local_58;
  mutable_buffers_1 local_30;
  
  this_00 = (vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
             *)operator_new(0x808);
  boost::container::
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ::vector(this_00,0x800);
  std::
  __shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,void>
            ((__shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,(__gnu_cxx::_Lock_policy)2>
              *)&data,(static_vector<unsigned_char,_2048UL,_void> *)this_00);
  __p = (basic_endpoint<boost::asio::ip::udp> *)operator_new(0x1c);
  *(undefined8 *)((long)&(__p->impl_).data_ + 8) = 0;
  *(undefined8 *)((long)&(__p->impl_).data_ + 0x10) = 0;
  (__p->impl_).data_.v6.sin6_scope_id = 0;
  *(undefined8 *)&(__p->impl_).data_ = 2;
  std::
  __shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,void>
            ((__shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,(__gnu_cxx::_Lock_policy)2>
              *)&from,__p);
  local_30.super_mutable_buffer.size_ =
       ((data.
         super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->
       super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
       ).m_holder.m_size;
  local_30.super_mutable_buffer.data_ =
       data.
       super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_58.this = this;
  std::
  __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_58.data.
                  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 ,&data.
                   super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                );
  std::
  __shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_58.from.
                super___shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>
               ,&from.
                 super___shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>
              );
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_receive_from<boost::asio::mutable_buffers_1,rudp::rudp_server::receive()::_lambda(boost::system::error_code_const&,unsigned_long)_1_>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->socket,&local_30,
             from.
             super___shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&local_58);
  receive()::{lambda(boost::system::error_code_const&,unsigned_long)#1}::~error_code
            ((_lambda_boost__system__error_code_const__unsigned_long__1_ *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&from.
              super___shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.
              super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void receive() {
    buffer_ptr_t data( new buffer_t( buffer_size ) );
    using boost::asio::ip::udp;
    std::shared_ptr< udp::endpoint > from( new udp::endpoint() );
    socket.async_receive_from(
      boost::asio::buffer( data->data(), data->size() ),
      *from,
      [this,data,from](
        const boost::system::error_code& error,
        size_t size
      ) {
        if( likely( !error ) ) {
          data->resize( size );
          receive();
	         auto &sess = sessions[ *from ];
	         if( !sess && is_syn( *data ) ) {
            sess.reset( new session( io_service, socket, *from, [this]( const boost::asio::ip::udp::endpoint &endpoint ) {
              auto s = sessions.find( endpoint );
              if( s != sessions.end() ) {
                session_bindings.erase( s->second->get_self_config().connection_identifier );
                sessions.erase( s );
              }
            } ) );
            session_bindings.insert( std::make_pair( sess->get_self_config().connection_identifier, *from ) );
          }
          if( sess ) {
            buffers_ptr_t received( new buffers_t() );
	           buffers_t response;
	           auto received_iter = std::back_inserter( *received );
            try {
	             sess->receive( data, received_iter );
	             if( !received->empty() )
                cb( *this, sess->get_self_config().connection_identifier, received );
              if( is_rst( *data ) ) {
                auto s = sessions.find( *from );
                if( s != sessions.end() ) {
                  session_bindings.erase( s->second->get_self_config().connection_identifier );
                  sessions.erase( s );
                }
              }
            } catch( const invalid_packet& ) {
              std::cout << "invalid packet" << std::endl;
            }
          }
        }
      }
    );
  }